

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_barrierback_(lua_State *L,GCObject *o)

{
  global_State *pgVar1;
  GCObject **pnext;
  bool local_21;
  global_State *g;
  GCObject *o_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  if (((o->marked & 0x20) == 0) || ((o->marked & (pgVar1->currentwhite ^ 0x18)) != 0)) {
    __assert_fail("(((o)->marked) & ((1<<(5)))) && !(((o)->marked) & (((g)->currentwhite ^ ((1<<(3)) | (1<<(4))))))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x13f,"void luaC_barrierback_(lua_State *, GCObject *)");
  }
  local_21 = false;
  if (1 < (o->marked & 7)) {
    local_21 = (o->marked & 7) != 5;
  }
  if ((pgVar1->gckind == '\x01') == local_21) {
    if ((o->marked & 7) == 6) {
      o->marked = o->marked & 199;
    }
    else {
      if (9 < (o->tt & 0xf)) {
        __assert_fail("(((o)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x144,"void luaC_barrierback_(lua_State *, GCObject *)");
      }
      pnext = getgclist(o);
      linkgclist_(o,pnext,&pgVar1->grayagain);
    }
    if (1 < (o->marked & 7)) {
      o->marked = o->marked & 0xf8 | 5;
    }
    return;
  }
  __assert_fail("(g->gckind == 1) == ((((o)->marked & 7) > 1) && ((o)->marked & 7) != 5)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x140,"void luaC_barrierback_(lua_State *, GCObject *)");
}

Assistant:

void luaC_barrierback_ (lua_State *L, GCObject *o) {
  global_State *g = G(L);
  lua_assert(isblack(o) && !isdead(g, o));
  lua_assert((g->gckind == KGC_GEN) == (isold(o) && getage(o) != G_TOUCHED1));
  if (getage(o) == G_TOUCHED2)  /* already in gray list? */
    set2gray(o);  /* make it gray to become touched1 */
  else  /* link it in 'grayagain' and paint it gray */
    linkobjgclist(o, g->grayagain);
  if (isold(o))  /* generational mode? */
    setage(o, G_TOUCHED1);  /* touched in current cycle */
}